

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::ProjectionLight::Projection(ProjectionLight *this,Vector3f *wl,SampledWavelengths *lambda)

{
  float fVar1;
  array<float,_4> aVar2;
  bool bVar3;
  RGB *pRVar4;
  int c;
  int c_00;
  Float FVar5;
  Vector2<float> VVar6;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar10 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar15 [60];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  Point3<float> PVar16;
  SampledSpectrum SVar17;
  RGB local_b8;
  undefined1 local_a8 [16];
  SampledSpectrum local_90;
  ProjectionLight *local_80;
  SampledWavelengths *local_78;
  WrapMode2D local_70;
  RGBSpectrum local_68;
  SampledSpectrum local_40;
  undefined1 auVar11 [56];
  
  fVar1 = (wl->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar10 = (undefined1  [56])0x0;
  if (this->hither <= fVar1) {
    local_68.rgb.r = (wl->super_Tuple3<pbrt::Vector3,_float>).x;
    local_68.rgb.g = (wl->super_Tuple3<pbrt::Vector3,_float>).y;
    auVar15 = ZEXT460((uint)local_68.rgb.g);
    local_68.rgb.b = fVar1;
    PVar16 = Transform::operator()(&this->ScreenFromLight,(Point3<float> *)&local_68);
    auVar12._60_4_ = 0;
    auVar12._0_60_ = auVar15;
    auVar12 = auVar12 << 0x20;
    auVar7._0_8_ = PVar16.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar7._8_56_ = auVar10;
    local_a8 = auVar7._0_16_;
    local_68.rgb._0_8_ = vmovlps_avx(local_a8);
    bVar3 = Inside<float>((Point2<float> *)&local_68,&this->screenBounds);
    if (bVar3) {
      local_68.rgb._0_8_ = vmovlps_avx(local_a8);
      local_78 = lambda;
      VVar6 = Bounds2<float>::Offset(&this->screenBounds,(Point2<float> *)&local_68);
      local_a8._8_8_ = extraout_XMM0_Qb;
      local_a8._0_4_ = VVar6.super_Tuple2<pbrt::Vector2,_float>.x;
      local_a8._4_4_ = VVar6.super_Tuple2<pbrt::Vector2,_float>.y;
      local_b8.r = 0.0;
      local_b8.g = 0.0;
      local_b8.b = 0.0;
      local_80 = this;
      for (c_00 = 0; auVar10 = auVar12._8_56_, c_00 != 3; c_00 = c_00 + 1) {
        WrapMode2D::WrapMode2D(&local_70,Clamp);
        FVar5 = Image::LookupNearestChannel(&this->image,(Point2f)local_a8._0_8_,c_00,local_70);
        pRVar4 = &local_b8;
        if ((c_00 != 0) && (pRVar4 = (RGB *)&local_b8.g, c_00 != 1)) {
          pRVar4 = (RGB *)&local_b8.b;
        }
        pRVar4->r = FVar5;
      }
      auVar11 = (undefined1  [56])0x0;
      local_a8._0_4_ = local_80->scale;
      RGBSpectrum::RGBSpectrum(&local_68,local_80->imageColorSpace,&local_b8);
      SVar17 = RGBSpectrum::Sample(&local_68,local_78);
      auVar13._0_8_ = SVar17.values.values._8_8_;
      auVar13._8_56_ = auVar10;
      auVar8._0_8_ = SVar17.values.values._0_8_;
      auVar8._8_56_ = auVar11;
      local_40.values.values = (array<float,_4>)vmovlhps_avx(auVar8._0_16_,auVar13._0_16_);
      auVar11 = (undefined1  [56])0x0;
      SVar17 = SampledSpectrum::operator*(&local_40,(Float)local_a8._0_4_);
      auVar14._0_8_ = SVar17.values.values._8_8_;
      auVar14._8_56_ = auVar10;
      auVar9._0_8_ = SVar17.values.values._0_8_;
      auVar9._8_56_ = auVar11;
      aVar2.values = (float  [4])vmovlhps_avx(auVar9._0_16_,auVar14._0_16_);
      return (SampledSpectrum)(array<float,_4>)aVar2.values;
    }
  }
  SampledSpectrum::SampledSpectrum(&local_90,0.0);
  return (array<float,_4>)(array<float,_4>)local_90;
}

Assistant:

SampledSpectrum ProjectionLight::Projection(const Vector3f &wl,
                                            const SampledWavelengths &lambda) const {
    // Discard directions behind projection light
    if (wl.z < hither)
        return SampledSpectrum(0.);

    // Project point onto projection plane and compute RGB
    Point3f ps = ScreenFromLight(Point3f(wl.x, wl.y, wl.z));
    if (!Inside(Point2f(ps.x, ps.y), screenBounds))
        return SampledSpectrum(0.f);
    Point2f st = Point2f(screenBounds.Offset(Point2f(ps.x, ps.y)));
    RGB rgb;
    for (int c = 0; c < 3; ++c)
        rgb[c] = image.LookupNearestChannel(st, c);

    return scale * RGBSpectrum(*imageColorSpace, rgb).Sample(lambda);
}